

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O0

void __thiscall
poplar::compact_bonsai_nlm<int,16ul>::
expand<poplar::compact_bonsai_trie<90u,3u,poplar::compact_hash_table<7u,80u,poplar::bijective_hash::split_mix_hasher>,poplar::standard_hash_table<80u,poplar::hash::vigna_hasher>,poplar::bijective_hash::split_mix_hasher>::node_map>
          (compact_bonsai_nlm<int,_16UL> *this,node_map *pos_map)

{
  char_range new_slice;
  bool bVar1;
  uint64_t uVar2;
  type_conflict *ptVar3;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  *in_RDI;
  pair<unsigned_long,_unsigned_long> pVar4;
  char_range cVar5;
  type_conflict *new_pos_in_chunk;
  type_conflict *new_chunk_id;
  char_range orig_slice;
  uint64_t new_pos;
  type_conflict *pos_in_chunk;
  type_conflict *chunk_id;
  uint64_t pos;
  this_type new_ls;
  compact_bonsai_nlm<int,_16UL> *in_stack_fffffffffffffec8;
  compact_bonsai_nlm<int,_16UL> *in_stack_fffffffffffffed0;
  uint8_t *in_stack_fffffffffffffee0;
  uint8_t *in_stack_fffffffffffffee8;
  pair<unsigned_long,_unsigned_long> *pos_in_chunk_00;
  undefined8 in_stack_ffffffffffffff08;
  uint32_t capa_bits;
  compact_bonsai_nlm<int,_16UL> *in_stack_ffffffffffffff10;
  ulong uVar6;
  uint8_t *in_stack_ffffffffffffff38;
  pair<unsigned_long,_unsigned_long> local_b0;
  char_range local_a0;
  pointer local_90;
  type_conflict *local_88;
  size_type *local_80;
  pair<unsigned_long,_unsigned_long> local_78 [2];
  ulong local_58;
  pointer local_20;
  pointer local_18;
  
  capa_bits = (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::size(in_RDI);
  bit_tools::ceil_log2((uint64_t)in_stack_fffffffffffffed0);
  compact_bonsai_nlm<int,_16UL>::compact_bonsai_nlm(in_stack_ffffffffffffff10,capa_bits);
  cVar5.end = in_stack_fffffffffffffee0;
  cVar5.begin = in_stack_fffffffffffffee8;
  local_58 = 0;
  while( true ) {
    uVar6 = local_58;
    uVar2 = compact_bonsai_trie<90U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
            ::node_map::size((node_map *)0x1d0b1d);
    if (uVar2 <= uVar6) break;
    pVar4 = decompose_value<16ul>((uint64_t)in_stack_fffffffffffffed0);
    pos_in_chunk_00 = local_78;
    local_78[0] = pVar4;
    local_80 = std::get<0ul,unsigned_long,unsigned_long>
                         ((pair<unsigned_long,_unsigned_long> *)0x1d0b7c);
    local_88 = std::get<1ul,unsigned_long,unsigned_long>
                         ((pair<unsigned_long,_unsigned_long> *)0x1d0b8e);
    local_90 = (pointer)compact_bonsai_trie<90U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                        ::node_map::operator[]((node_map *)cVar5.begin,(uint64_t)cVar5.end);
    if (local_90 != (pointer)0xffffffffffffffff) {
      cVar5 = compact_bonsai_nlm<int,_16UL>::get_slice_
                        ((compact_bonsai_nlm<int,_16UL> *)pVar4.second,(uint64_t)local_90,
                         (uint64_t)pos_in_chunk_00);
      local_a0 = cVar5;
      bVar1 = char_range::empty(&local_a0);
      if (!bVar1) {
        pVar4 = decompose_value<16ul>((uint64_t)in_stack_fffffffffffffed0);
        in_stack_fffffffffffffed0 = (compact_bonsai_nlm<int,_16UL> *)pVar4.second;
        in_stack_fffffffffffffec8 = (compact_bonsai_nlm<int,_16UL> *)&local_b0;
        local_b0 = pVar4;
        std::get<0ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x1d0c6d);
        ptVar3 = std::get<1ul,unsigned_long,unsigned_long>
                           ((pair<unsigned_long,_unsigned_long> *)0x1d0c7e);
        new_slice.end = (uint8_t *)ptVar3;
        new_slice.begin = in_stack_ffffffffffffff38;
        compact_bonsai_nlm<int,_16UL>::set_slice_
                  ((compact_bonsai_nlm<int,_16UL> *)local_a0.end,(uint64_t)local_a0.begin,
                   (uint64_t)in_RDI,new_slice);
      }
    }
    if (*local_88 == 0xf) {
      std::
      vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
      ::operator[](in_RDI,*local_80);
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::reset
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    local_58 = local_58 + 1;
  }
  local_20 = in_RDI[2].
             super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_18 = in_RDI[2].
             super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  compact_bonsai_nlm<int,_16UL>::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  compact_bonsai_nlm<int,_16UL>::~compact_bonsai_nlm(in_stack_fffffffffffffed0);
  return;
}

Assistant:

void expand(const T& pos_map) {
        this_type new_ls(bit_tools::ceil_log2(ptrs_.size() * ChunkSize * 2));

        for (uint64_t pos = 0; pos < pos_map.size(); ++pos) {
            auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(pos);
            uint64_t new_pos = pos_map[pos];
            if (new_pos != UINT64_MAX) {
                auto orig_slice = get_slice_(chunk_id, pos_in_chunk);
                if (!orig_slice.empty()) {
                    auto [new_chunk_id, new_pos_in_chunk] = decompose_value<ChunkSize>(new_pos);
                    new_ls.set_slice_(new_chunk_id, new_pos_in_chunk, orig_slice);
                }
            }
            if (pos_in_chunk == ChunkSize - 1) {
                ptrs_[chunk_id].reset();
            }
        }

        new_ls.size_ = size_;
#ifdef POPLAR_EXTRA_STATS
        new_ls.max_length_ = max_length_;
        new_ls.sum_length_ = sum_length_;
#endif
        new_ls.label_bytes_ = label_bytes_;
        *this = std::move(new_ls);
    }